

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.cpp
# Opt level: O3

void __thiscall
crnlib::dxt5_endpoint_optimizer::evaluate_solution
          (dxt5_endpoint_optimizer *this,uint low_endpoint,uint high_endpoint)

{
  byte bVar1;
  bool bVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  results *prVar11;
  uint uVar12;
  uchar uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint8 uVar17;
  uint selector_values [8];
  uint local_58 [10];
  
  bVar2 = true;
  uVar17 = '\0';
  do {
    if (bVar2) {
      dxt5_block::get_block_values8(local_58,low_endpoint,high_endpoint);
    }
    else {
      dxt5_block::get_block_values6(local_58,low_endpoint,high_endpoint);
    }
    if ((this->m_unique_values).m_size == 0) {
      prVar11 = this->m_pResults;
      uVar10 = prVar11->m_error;
      uVar8 = 0;
    }
    else {
      uVar9 = 0;
      uVar8 = 0;
      do {
        uVar12 = 0xffffffff;
        uVar10 = 0;
        uVar14 = 0;
        do {
          iVar16 = (uint)(this->m_unique_values).m_p[uVar9] - local_58[uVar10];
          uVar15 = iVar16 * (this->m_unique_value_weights).m_p[uVar9] * iVar16;
          if (uVar15 < uVar12) {
            if (uVar15 == 0) {
              uVar12 = 0;
              uVar13 = (uchar)uVar10;
              break;
            }
            uVar14 = uVar10 & 0xffffffff;
            uVar12 = uVar15;
          }
          uVar13 = (uchar)uVar14;
          uVar10 = uVar10 + 1;
        } while (uVar10 != 8);
        (this->m_trial_selectors).m_p[uVar9] = uVar13;
        uVar8 = uVar8 + uVar12;
        prVar11 = this->m_pResults;
        uVar10 = prVar11->m_error;
      } while ((uVar8 <= uVar10) && (uVar9 = uVar9 + 1, uVar9 < (this->m_unique_values).m_size));
    }
    if (uVar8 < uVar10) {
      prVar11->m_error = uVar8;
      prVar11->m_first_endpoint = (uint8)low_endpoint;
      prVar11->m_second_endpoint = (uint8)high_endpoint;
      prVar11->m_block_type = uVar17;
      uVar4 = (this->m_trial_selectors).m_size;
      uVar5 = (this->m_trial_selectors).m_capacity;
      puVar3 = (this->m_best_selectors).m_p;
      uVar6 = (this->m_best_selectors).m_size;
      uVar7 = (this->m_best_selectors).m_capacity;
      (this->m_best_selectors).m_p = (this->m_trial_selectors).m_p;
      (this->m_best_selectors).m_size = uVar4;
      (this->m_best_selectors).m_capacity = uVar5;
      (this->m_trial_selectors).m_p = puVar3;
      (this->m_trial_selectors).m_size = uVar6;
      (this->m_trial_selectors).m_capacity = uVar7;
      if (uVar8 == 0) {
        return;
      }
    }
    uVar17 = '\x01';
    bVar1 = this->m_pParams->m_use_both_block_types & bVar2;
    bVar2 = false;
    if (bVar1 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void dxt5_endpoint_optimizer::evaluate_solution(uint low_endpoint, uint high_endpoint)
    {
        for (uint block_type = 0; block_type < (m_pParams->m_use_both_block_types ? 2U : 1U); block_type++)
        {
            uint selector_values[8];

            if (!block_type)
            {
                dxt5_block::get_block_values8(selector_values, low_endpoint, high_endpoint);
            }
            else
            {
                dxt5_block::get_block_values6(selector_values, low_endpoint, high_endpoint);
            }

            uint64 trial_error = 0;

            for (uint i = 0; i < m_unique_values.size(); i++)
            {
                const uint val = m_unique_values[i];
                const uint weight = m_unique_value_weights[i];

                uint best_selector_error = UINT_MAX;
                uint best_selector = 0;

                for (uint j = 0; j < 8; j++)
                {
                    int selector_error = val - selector_values[j];
                    selector_error = selector_error * selector_error * (int)weight;

                    if (static_cast<uint>(selector_error) < best_selector_error)
                    {
                        best_selector_error = selector_error;
                        best_selector = j;
                        if (!best_selector_error)
                        {
                            break;
                        }
                    }
                }

                m_trial_selectors[i] = static_cast<uint8>(best_selector);
                trial_error += best_selector_error;

                if (trial_error > m_pResults->m_error)
                {
                    break;
                }
            }

            if (trial_error < m_pResults->m_error)
            {
                m_pResults->m_error = trial_error;
                m_pResults->m_first_endpoint = static_cast<uint8>(low_endpoint);
                m_pResults->m_second_endpoint = static_cast<uint8>(high_endpoint);
                m_pResults->m_block_type = static_cast<uint8>(block_type);
                m_best_selectors.swap(m_trial_selectors);

                if (!trial_error)
                {
                    break;
                }
            }
        }
    }